

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<BLOCK_SIZE,int,void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long),void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::AdvanceIfEnd<2ul>
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  ParamIterator<int> *this_00;
  size_t NextI;
  bool last;
  ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
  *in_stack_ffffffffffffffc8;
  ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
  *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  
  std::
  get<2ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
            ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
              *)0xc63ddc);
  std::
  get<2ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
            ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
              *)0xc63def);
  bVar1 = ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
          ::operator!=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (!bVar1) {
    uVar2 = 0;
    this_00 = (ParamIterator<int> *)
              std::
              get<2ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
                        ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                          *)0xc63e29);
    std::
    get<2ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
              ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                *)0xc63e3c);
    ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
    ::operator=((ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
                 *)this_00,in_stack_ffffffffffffffc8);
    std::
    get<1ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
              ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                *)0xc63e57);
    ParamIterator<int>::operator++(this_00);
    AdvanceIfEnd<1ul>((IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *)
                      CONCAT17(uVar2,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }